

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O3

void outputDomains(DomainSet *dSet,string *fname,MatrixProperties *matProp,int start,float hier)

{
  pointer pDVar1;
  ostream *poVar2;
  pointer pDVar3;
  ofstream file;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)fname);
  pDVar3 = (dSet->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (dSet->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar3 != pDVar1) {
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,(matProp->chrom)._M_dataplus._M_p,
                          (matProp->chrom)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Matryoshka1.0",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Domain",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Level=",6);
      poVar2 = std::ostream::_M_insert<double>((double)hier);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      pDVar3 = pDVar3 + 1;
    } while (pDVar3 != pDVar1);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _strtod;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void outputDomains(DomainSet dSet, string fname, MatrixProperties matProp, int start, float hier) {
    ofstream file;
    file.open(fname, ios::app);
    int res = matProp.resolution;
    for (auto d : dSet) {
        //file << matProp.chrom << "\t" << (d.start+start)*res << "\t" << (d.end+start)*res << "\t" << hier << endl;
        //file << chromosome << tool << feature << start << end << score << strand << frame << hier << endl;
        file << matProp.chrom << "\t" << "Matryoshka1.0" << "\t" << "Domain" << "\t" << (d.start)*res << "\t" <<
            (d.end)*res << "\t" << "." << "\t" << "." << "\t" << "." << "\t" << "Level=" << hier << endl;
    }
    file.close();
}